

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O0

void tcg_gen_divu_i32_ppc64(TCGContext_conflict10 *tcg_ctx,TCGv_i32 ret,TCGv_i32 arg1,TCGv_i32 arg2)

{
  TCGv_i32 ret_00;
  TCGv_i32 t0;
  TCGv_i32 arg2_local;
  TCGv_i32 arg1_local;
  TCGv_i32 ret_local;
  TCGContext_conflict10 *tcg_ctx_local;
  
  ret_00 = tcg_temp_new_i32(tcg_ctx);
  tcg_gen_movi_i32(tcg_ctx,ret_00,0);
  tcg_gen_op5_i32(tcg_ctx,INDEX_op_divu2_i32,ret,ret_00,arg1,ret_00,arg2);
  tcg_temp_free_i32(tcg_ctx,ret_00);
  return;
}

Assistant:

void tcg_gen_divu_i32(TCGContext *tcg_ctx, TCGv_i32 ret, TCGv_i32 arg1, TCGv_i32 arg2)
{
    if (TCG_TARGET_HAS_div_i32) {
        tcg_gen_op3_i32(tcg_ctx, INDEX_op_divu_i32, ret, arg1, arg2);
    } else if (TCG_TARGET_HAS_div2_i32) {
        TCGv_i32 t0 = tcg_temp_new_i32(tcg_ctx);
        tcg_gen_movi_i32(tcg_ctx, t0, 0);
        tcg_gen_op5_i32(tcg_ctx, INDEX_op_divu2_i32, ret, t0, arg1, t0, arg2);
        tcg_temp_free_i32(tcg_ctx, t0);
    } else {
        gen_helper_divu_i32(tcg_ctx, ret, arg1, arg2);
    }
}